

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::FormatBracketedOptions
               (int depth,Message *options,DescriptorPool *pool,string *output)

{
  undefined1 uVar1;
  bool bVar2;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000a8;
  DescriptorPool *in_stack_000000b0;
  Message *in_stack_000000b8;
  int in_stack_000000c0;
  undefined7 in_stack_ffffffffffffff90;
  string local_68 [24];
  char *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4b416c);
  uVar1 = RetrieveOptions(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  if ((bool)uVar1) {
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::append(in_RCX);
    std::__cxx11::string::~string(local_68);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool FormatBracketedOptions(int depth, const Message& options,
                            const DescriptorPool* pool, std::string* output) {
  std::vector<std::string> all_options;
  if (RetrieveOptions(depth, options, pool, &all_options)) {
    output->append(Join(all_options, ", "));
  }
  return !all_options.empty();
}